

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.c
# Opt level: O1

void ReduceResult(void *simContext,char *outputFile,void *id,uint32_t resultLength,void *result)

{
  if (resultLength == 0x10) {
    *(double *)simContext = *result + *simContext;
    *(double *)((long)simContext + 8) =
         *(double *)((long)result + 8) + *(double *)((long)simContext + 8);
  }
  return;
}

Assistant:

void ReduceResult(void * simContext, char const * outputFile, void const * id, uint32_t resultLength, void const * result)
{
    TContext * context = simContext;

    UNUSED_PARAMETER(outputFile);
    UNUSED_PARAMETER(id);

    /* Validate input size */
    if (resultLength != 2 * sizeof(double))
    {
        return;
    }

    /* Increment counters */
    context->fTotal += ((double *)result)[0];
    context->fInside += ((double *)result)[1];
}